

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O3

void __thiscall cmOrderDirectories::FindImplicitConflicts(cmOrderDirectories *this)

{
  cmake *this_00;
  bool bVar1;
  pointer ppcVar2;
  ostream *poVar3;
  string *psVar4;
  ulong uVar5;
  ulong uVar6;
  string text;
  ostringstream w;
  ostringstream conflicts;
  long *local_368;
  long local_360;
  long local_358 [2];
  string local_348;
  cmListFileBacktrace local_328;
  undefined1 local_308 [376];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  ppcVar2 = (this->ImplicitDirEntries).
            super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->ImplicitDirEntries).
      super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppcVar2) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      cmOrderDirectoriesConstraint::FindImplicitConflicts(ppcVar2[uVar5],(ostringstream *)local_190)
      ;
      ppcVar2 = (this->ImplicitDirEntries).
                super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar1 = uVar6 < (ulong)((long)(this->ImplicitDirEntries).
                                    super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar2 >> 3)
      ;
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar1);
  }
  std::__cxx11::stringbuf::str();
  if (local_360 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_308,"Cannot generate a safe ",0x17);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_308,(this->Purpose)._M_dataplus._M_p,
                        (this->Purpose)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," for target ",0xc);
    psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," because files in some directories may conflict with ",0x35);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," libraries in implicit directories:\n",0x24);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_368,local_360);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"Some of these libraries may not be found correctly.",0x33);
    this_00 = this->GlobalGenerator->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmGeneratorTarget::GetBacktrace(&local_328,this->Target);
    cmake::IssueMessage(this_00,WARNING,&local_348,&local_328);
    cmListFileBacktrace::~cmListFileBacktrace(&local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
    std::ios_base::~ios_base((ios_base *)(local_308 + 0x70));
  }
  if (local_368 != local_358) {
    operator_delete(local_368,local_358[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void cmOrderDirectories::FindImplicitConflicts()
{
  // Check for items in implicit link directories that have conflicts
  // in the explicit directories.
  std::ostringstream conflicts;
  for (unsigned int i = 0; i < this->ImplicitDirEntries.size(); ++i) {
    this->ImplicitDirEntries[i]->FindImplicitConflicts(conflicts);
  }

  // Skip warning if there were no conflicts.
  std::string text = conflicts.str();
  if (text.empty()) {
    return;
  }

  // Warn about the conflicts.
  std::ostringstream w;
  w << "Cannot generate a safe " << this->Purpose << " for target "
    << this->Target->GetName()
    << " because files in some directories may conflict with "
    << " libraries in implicit directories:\n"
    << text << "Some of these libraries may not be found correctly.";
  this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
    cmake::WARNING, w.str(), this->Target->GetBacktrace());
}